

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  char cVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar10;
  undefined8 *puVar11;
  pointer pbVar12;
  ulong *remote;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar13;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  int iVar14;
  pointer this_00;
  _List_node_base *p_Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  bool bVar17;
  string targetFile;
  string inFile;
  string filePath;
  string inFileRelative;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  string subdir;
  string findExpr;
  ostringstream cmCPackLog_msg;
  Glob gl;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  string local_380;
  byte local_359;
  string local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [40];
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string local_258;
  pointer local_238;
  string *local_230;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [4];
  ios_base local_1b8 [72];
  char *local_170;
  undefined1 local_b0 [81];
  bool local_5f;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_58.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_start = (RegularExpression *)0x0;
  local_58.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (RegularExpression *)0x0;
  local_58.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230 = tempInstallDirectory;
  local_228._0_8_ = &local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"CPACK_IGNORE_FILES","");
  pcVar7 = GetOption(this,(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &local_218) {
    operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
  }
  if (pcVar7 != (char *)0x0) {
    local_2f8._0_8_ = (pointer)0x0;
    local_2f8._8_8_ = (pointer)0x0;
    local_2f8._16_8_ = (pointer)0x0;
    local_228._0_8_ = &local_218;
    sVar8 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,pcVar7,pcVar7 + sVar8);
    cmSystemTools::ExpandListArgument
              ((string *)local_228,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
    }
    if (local_2f8._0_8_ != local_2f8._8_8_) {
      pbVar12 = (pointer)local_2f8._0_8_;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"Create ignore files regex for: ",0x1f);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_228,(pbVar12->_M_dataplus)._M_p,
                            pbVar12->_M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar13 = local_b0._0_8_;
        sVar8 = strlen((char *)local_b0._0_8_);
        cmCPackLog::Log(pcVar2,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x14d,(char *)uVar13,sVar8);
        if ((GlobInternals *)local_b0._0_8_ != (GlobInternals *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
        std::ios_base::~ios_base(local_1b8);
        pcVar7 = (pbVar12->_M_dataplus)._M_p;
        local_170 = (char *)0x0;
        if (pcVar7 != (char *)0x0) {
          cmsys::RegularExpression::compile((RegularExpression *)local_228,pcVar7);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
        emplace_back<cmsys::RegularExpression>(&local_58,(RegularExpression *)local_228);
        if (local_170 != (char *)0x0) {
          operator_delete__(local_170);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != (pointer)local_2f8._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f8);
  }
  local_228._0_8_ = &local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"CPACK_INSTALLED_DIRECTORIES","");
  pcVar7 = GetOption(this,(string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &local_218) {
    operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
  }
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228._0_8_ = &local_218;
    sVar8 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,pcVar7,pcVar7 + sVar8);
    cmSystemTools::ExpandListArgument((string *)local_228,&local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
    }
    if (((int)local_2b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)local_2b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                 ,0xac);
      std::ios::widen((char)(ostream *)local_228 + (char)*(undefined8 *)(local_228._0_8_ + -0x18));
      std::ostream::put((char)local_228);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar13 = local_b0._0_8_;
      sVar8 = strlen((char *)local_b0._0_8_);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x15d,(char *)uVar13,sVar8);
      if ((GlobInternals *)local_b0._0_8_ != (GlobInternals *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base(local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b8);
      iVar14 = 0;
      goto LAB_0023c567;
    }
    bVar17 = local_2b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_2b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar17) {
      local_38 = &this->files;
      pbVar12 = local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2d0;
        local_2d0._M_impl._M_node._M_size = 0;
        local_359 = bVar17;
        local_2d0._M_impl._M_node.super__List_node_base._M_prev =
             local_2d0._M_impl._M_node.super__List_node_base._M_next;
        local_238 = pbVar12;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"Find files",10);
        cVar4 = (char)(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_228;
        std::ios::widen((char)*(undefined8 *)(local_228._0_8_ + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar13 = local_b0._0_8_;
        sVar8 = strlen((char *)local_b0._0_8_);
        cmCPackLog::Log(pcVar2,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x167,(char *)uVar13,sVar8);
        if ((GlobInternals *)local_b0._0_8_ != (GlobInternals *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
        std::ios_base::~ios_base(local_1b8);
        cmsys::Glob::Glob((Glob *)local_b0);
        pbVar12 = local_238;
        local_2f8._0_8_ = local_2f8 + 0x10;
        pcVar3 = (local_238->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2f8,pcVar3,pcVar3 + local_238->_M_string_length);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        pcVar3 = pbVar12[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,pcVar3,pcVar3 + pbVar12[1]._M_string_length);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_2f8._0_8_,
                   (char *)((long)&((_Alloc_hider *)local_2f8._8_8_)->_M_p +
                           (long)&((_Alloc_hider *)local_2f8._0_8_)->_M_p));
        std::__cxx11::string::append((char *)&local_258);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"- Install directory: ",0x15);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_228,(char *)local_2f8._0_8_,local_2f8._8_8_);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        _Var5._M_p = local_358._M_dataplus._M_p;
        sVar8 = strlen(local_358._M_dataplus._M_p);
        cmCPackLog::Log(pcVar2,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x16f,_Var5._M_p,sVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
        std::ios_base::~ios_base(local_1b8);
        local_b0[8] = true;
        local_5f = true;
        bVar17 = cmsys::Glob::FindFiles((Glob *)local_b0,&local_258,(GlobMessages *)0x0);
        if (!bVar17) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Cannot find any files in the installed directory",0x30);
          std::ios::widen((char)(ostream *)local_228 +
                          (char)*(undefined8 *)(local_228._0_8_ + -0x18));
          std::ostream::put((char)local_228);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_358._M_dataplus._M_p;
          sVar8 = strlen(local_358._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x175,_Var5._M_p,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
          std::ios_base::~ios_base(local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
            operator_delete((void *)local_2f8._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_2f8._16_8_)->_M_p + 1));
          }
          cmsys::Glob::~Glob((Glob *)local_b0);
          std::__cxx11::
          _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_clear(&local_2d0);
LAB_0023c54c:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2b8);
          iVar14 = 0;
          if ((local_359 & 1) != 0) goto LAB_0023c562;
          goto LAB_0023c567;
        }
        __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(local_38,__x);
        uVar13 = extraout_RDX;
        for (pbVar12 = (this->files).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar12 !=
            (this->files).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          pcVar3 = (pbVar12->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_358,pcVar3,pcVar3 + pbVar12->_M_string_length);
          bVar17 = cmsys::SystemTools::FileIsDirectory(pbVar12);
          if (bVar17) {
            std::__cxx11::string::push_back((char)&local_358);
          }
          if (local_58.
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_58.
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0023b61a:
            paVar16 = &local_380.field_2;
            local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
            pcVar3 = (local_230->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_338,pcVar3,pcVar3 + local_230->_M_string_length);
            std::operator+(&local_318,"/",&local_298);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_318);
            remote = (ulong *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)remote) {
              local_380.field_2._M_allocated_capacity = *remote;
              local_380.field_2._8_8_ = plVar10[3];
              local_380._M_dataplus._M_p = (pointer)paVar16;
            }
            else {
              local_380.field_2._M_allocated_capacity = *remote;
              local_380._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_380._M_string_length = plVar10[1];
            *plVar10 = (long)remote;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            cmSystemTools::RelativePath_abi_cxx11_
                      (&local_278,(cmSystemTools *)local_2f8._0_8_,(pbVar12->_M_dataplus)._M_p,
                       (char *)remote);
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar16) {
              uVar13 = local_380.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_278._M_string_length + local_380._M_string_length) {
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                uVar13 = local_278.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 < local_278._M_string_length + local_380._M_string_length)
              goto LAB_0023b713;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_278,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p
                                  );
            }
            else {
LAB_0023b713:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_380,(ulong)local_278._M_dataplus._M_p);
            }
            local_228._0_8_ = &local_218;
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar1) {
              local_218._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_218._8_8_ = puVar11[3];
            }
            else {
              local_218._M_allocated_capacity = paVar1->_M_allocated_capacity;
              local_228._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar11;
            }
            local_228._8_8_ = puVar11[1];
            *puVar11 = paVar1;
            puVar11[1] = 0;
            paVar1->_M_local_buf[0] = '\0';
            std::__cxx11::string::_M_append((char *)&local_338,local_228._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ != &local_218) {
              operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar16) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,"Copy file: ",0xb);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_228,local_358._M_dataplus._M_p,
                                local_358._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> ",4);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_338._M_dataplus._M_p,local_338._M_string_length);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_380._M_dataplus._M_p;
            sVar8 = strlen(local_380._M_dataplus._M_p);
            pcVar7 = (char *)0x196;
            cmCPackLog::Log(pcVar2,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x196,_Var5._M_p,sVar8);
            paVar16 = &local_380.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != paVar16) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
            std::ios_base::~ios_base(local_1b8);
            bVar17 = cmsys::SystemTools::FileIsSymlink(&local_358);
            if (bVar17) {
              local_380._M_string_length = 0;
              local_380.field_2._M_allocated_capacity =
                   local_380.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_380._M_dataplus._M_p = (pointer)paVar16;
              cmSystemTools::RelativePath_abi_cxx11_
                        (&local_318,(cmSystemTools *)local_2f8._0_8_,local_358._M_dataplus._M_p,
                         pcVar7);
              cmsys::SystemTools::ReadSymlink(&local_358,&local_380);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_228,&local_380,&local_318);
              std::__cxx11::
              list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::_M_insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_2d0,(iterator)&local_2d0,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_228);
              uVar13 = extraout_RDX_02;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_p != local_1f8) {
                operator_delete(local_208._M_p,(ulong)(local_1f8[0]._M_allocated_capacity + 1));
                uVar13 = extraout_RDX_03;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._0_8_ != &local_218) {
                operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
                uVar13 = extraout_RDX_04;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
                uVar13 = extraout_RDX_05;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != paVar16) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
                uVar13 = extraout_RDX_06;
              }
              iVar14 = 0;
            }
            else {
              bVar17 = cmSystemTools::CopyFileIfDifferent
                                 (local_358._M_dataplus._M_p,local_338._M_dataplus._M_p);
              if (bVar17) {
                bVar17 = cmSystemTools::CopyFileTime
                                   (local_358._M_dataplus._M_p,local_338._M_dataplus._M_p);
                iVar14 = 0;
                uVar13 = extraout_RDX_07;
                if (bVar17) goto LAB_0023bb56;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"Problem copying file: ",0x16);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_228,local_358._M_dataplus._M_p,
                                  local_358._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> ",4);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_338._M_dataplus._M_p,local_338._M_string_length);
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var5._M_p = local_380._M_dataplus._M_p;
              sVar8 = strlen(local_380._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1a9,_Var5._M_p,sVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
              std::ios_base::~ios_base(local_1b8);
              iVar14 = 1;
              uVar13 = extraout_RDX_08;
            }
LAB_0023bb56:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p != &local_338.field_2) {
              operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1
                             );
              uVar13 = extraout_RDX_09;
            }
          }
          else {
            bVar17 = false;
            this_00 = local_58.
                      super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              bVar6 = cmsys::RegularExpression::find(this_00,local_358._M_dataplus._M_p);
              uVar13 = extraout_RDX_00;
              if (bVar6) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_228,"Ignore file: ",0xd);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_228,local_358._M_dataplus._M_p,
                                    local_358._M_string_length);
                std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                pcVar2 = this->Logger;
                std::__cxx11::stringbuf::str();
                _Var5._M_p = local_338._M_dataplus._M_p;
                sVar8 = strlen(local_338._M_dataplus._M_p);
                cmCPackLog::Log(pcVar2,2,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x18a,_Var5._M_p,sVar8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_dataplus._M_p != &local_338.field_2) {
                  operator_delete(local_338._M_dataplus._M_p,
                                  local_338.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
                std::ios_base::~ios_base(local_1b8);
                bVar17 = true;
                uVar13 = extraout_RDX_01;
              }
              this_00 = this_00 + 1;
            } while (this_00 !=
                     local_58.
                     super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
            iVar14 = 0x14;
            if (!bVar17) goto LAB_0023b61a;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
            uVar13 = extraout_RDX_10;
          }
          if ((iVar14 != 0x14) && (iVar14 != 0)) goto LAB_0023c221;
        }
        if (local_2d0._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_2d0
           ) {
LAB_0023c21c:
          bVar17 = true;
        }
        else {
          cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                    (&local_358,(SystemTools *)0x1,SUB81(uVar13,0));
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          pcVar3 = (local_230->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_338,pcVar3,pcVar3 + local_230->_M_string_length);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_228,"/",&local_298);
          std::__cxx11::string::_M_append((char *)&local_338,local_228._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._0_8_ != &local_218) {
            operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Change dir to: ",0xf);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_228,local_338._M_dataplus._M_p,
                              local_338._M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_380._M_dataplus._M_p;
          sVar8 = strlen(local_380._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x1b5,_Var5._M_p,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
          std::ios_base::~ios_base(local_1b8);
          cmsys::SystemTools::ChangeDirectory(&local_338);
          for (p_Var15 = local_2d0._M_impl._M_node.super__List_node_base._M_next;
              p_Var15 != (_List_node_base *)&local_2d0;
              p_Var15 = (((_List_impl *)&p_Var15->_M_next)->_M_node).super__List_node_base._M_next)
          {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_228,"Will create a symlink: ",0x17);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_228,
                                (char *)(((_List_impl *)&p_Var15[3]._M_next)->_M_node).
                                        super__List_node_base._M_next,(long)p_Var15[3]._M_prev);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"--> ",4);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)p_Var15[1]._M_next,(long)p_Var15[1]._M_prev);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_380._M_dataplus._M_p;
            sVar8 = strlen(local_380._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x1bd,_Var5._M_p,sVar8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
            std::ios_base::~ios_base(local_1b8);
            cmsys::SystemTools::GetFilenamePath(&local_380,(string *)(p_Var15 + 3));
            if (local_380._M_string_length != 0) {
              bVar17 = cmsys::SystemTools::MakeDirectory(&local_380);
              if (!bVar17) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_228,"Cannot create dir: ",0x13);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_228,local_380._M_dataplus._M_p,
                                    local_380._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"\nTrying to create symlink: ",0x1b);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)(((_List_impl *)&p_Var15[3]._M_next)->_M_node).
                                                   super__List_node_base._M_next,
                                    (long)p_Var15[3]._M_prev);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"--> ",4);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)p_Var15[1]._M_next,(long)p_Var15[1]._M_prev);
                std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                pcVar2 = this->Logger;
                std::__cxx11::stringbuf::str();
                _Var5._M_p = local_318._M_dataplus._M_p;
                sVar8 = strlen(local_318._M_dataplus._M_p);
                cmCPackLog::Log(pcVar2,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1c8,_Var5._M_p,sVar8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_dataplus._M_p != &local_318.field_2) {
                  operator_delete(local_318._M_dataplus._M_p,
                                  local_318.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
                std::ios_base::~ios_base(local_1b8);
              }
            }
            bVar17 = cmsys::SystemTools::CreateSymlink
                               ((string *)(p_Var15 + 1),(string *)(p_Var15 + 3));
            if (bVar17) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_228,"Cannot create symlink: ",0x17);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_228,
                                  (char *)(((_List_impl *)&p_Var15[3]._M_next)->_M_node).
                                          super__List_node_base._M_next,(long)p_Var15[3]._M_prev);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"--> ",4);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,(char *)p_Var15[1]._M_next,(long)p_Var15[1]._M_prev);
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              _Var5._M_p = local_318._M_dataplus._M_p;
              sVar8 = strlen(local_318._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1cf,_Var5._M_p,sVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
              std::ios_base::~ios_base(local_1b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
              if (!bVar17) goto LAB_0023c1dd;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"Going back to: ",0xf);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_228,local_358._M_dataplus._M_p,
                              local_358._M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_380._M_dataplus._M_p;
          sVar8 = strlen(local_380._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x1d4,_Var5._M_p,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
          std::ios_base::~ios_base(local_1b8);
          cmsys::SystemTools::ChangeDirectory(&local_358);
LAB_0023c1dd:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          if (p_Var15 == (_List_node_base *)&local_2d0) goto LAB_0023c21c;
LAB_0023c221:
          bVar17 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
          operator_delete((void *)local_2f8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_2f8._16_8_)->_M_p + 1));
        }
        cmsys::Glob::~Glob((Glob *)local_b0);
        std::__cxx11::
        _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_clear(&local_2d0);
        if (!bVar17) goto LAB_0023c54c;
        pbVar12 = local_238 + 2;
        bVar17 = pbVar12 ==
                 local_2b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (!bVar17);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b8);
  }
LAB_0023c562:
  iVar14 = 1;
LAB_0023c567:
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&local_58);
  return iVar14;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if ( cpackIgnoreFiles )
    {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    std::vector<std::string>::iterator it;
    for ( it = ignoreFilesRegexString.begin();
      it != ignoreFilesRegexString.end();
      ++it )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
        "Create ignore files regex for: " << *it << std::endl);
      ignoreFilesRegex.push_back(it->c_str());
      }
    }
  const char* installDirectories
    = this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if ( installDirectories && *installDirectories )
    {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
      installDirectoriesVector);
    if ( installDirectoriesVector.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation." << std::endl);
      return 0;
      }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for ( it = installDirectoriesVector.begin();
      it != installDirectoriesVector.end();
      ++it )
      {
      std::list<std::pair<std::string,std::string> > symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it ++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
        "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if ( !gl.FindFiles(findExpr) )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Cannot find any files in the installed directory" << std::endl);
        return 0;
        }
      files = gl.GetFiles();
      std::vector<std::string>::iterator gfit;
      std::vector<cmsys::RegularExpression>::iterator regIt;
      for ( gfit = files.begin(); gfit != files.end(); ++ gfit )
        {
        bool skip = false;
        std::string inFile = *gfit;
        if(cmSystemTools::FileIsDirectory(*gfit))
          {
          inFile += '/';
          }
        for ( regIt= ignoreFilesRegex.begin();
          regIt!= ignoreFilesRegex.end();
          ++ regIt)
          {
          if ( regIt->find(inFile.c_str()) )
            {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Ignore file: "
              << inFile << std::endl);
            skip = true;
            }
          }
        if ( skip )
          {
          continue;
          }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/"
          + cmSystemTools::RelativePath(top.c_str(), gfit->c_str());
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Copy file: "
          << inFile << " -> " << filePath << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if ( cmSystemTools::FileIsSymlink(inFile))
          {
          std::string targetFile;
          std::string inFileRelative =
             cmSystemTools::RelativePath(top.c_str(),inFile.c_str());
          cmSystemTools::ReadSymlink(inFile,targetFile);
          symlinkedFiles.push_back(std::pair<std::string,
                                   std::string>(targetFile,inFileRelative));
          }
        /* If it is not a symlink then do a plain copy */
        else if (!(
            cmSystemTools::CopyFileIfDifferent(inFile.c_str(),filePath.c_str())
            &&
            cmSystemTools::CopyFileTime(inFile.c_str(),filePath.c_str())
                ) )
          {
          cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem copying file: "
            << inFile << " -> " << filePath << std::endl);
          return 0;
          }
        }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty())
        {
        std::list< std::pair<std::string,std::string> >::iterator symlinkedIt;
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir  += "/"+subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir <<std::endl);
        cmSystemTools::ChangeDirectory(goToDir);
        for (symlinkedIt=symlinkedFiles.begin();
             symlinkedIt != symlinkedFiles.end();
             ++symlinkedIt)
          {
          cmCPackLogger(cmCPackLog::LOG_DEBUG, "Will create a symlink: "
                         << symlinkedIt->second << "--> "
                         << symlinkedIt->first << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinkedIt->second);
          if(!destDir.empty() && !cmSystemTools::MakeDirectory(destDir))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create dir: "
                          << destDir
                          << "\nTrying to create symlink: "
                          << symlinkedIt->second << "--> "
                          << symlinkedIt->first
                          << std::endl);
            }
          if (!cmSystemTools::CreateSymlink(symlinkedIt->first,
                                            symlinkedIt->second))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create symlink: "
                            << symlinkedIt->second << "--> "
                            << symlinkedIt->first << std::endl);
            return 0;
            }
          }
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Going back to: "
                      << curDir <<std::endl);
        cmSystemTools::ChangeDirectory(curDir);
        }
      }
    }
  return 1;
}